

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RTCFilterFunctionN p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  byte bVar34;
  int iVar35;
  AABBNodeMB4D *node1;
  byte bVar36;
  long lVar37;
  undefined1 (*pauVar38) [32];
  NodeRef root;
  byte bVar39;
  uint uVar40;
  undefined4 uVar41;
  ulong uVar42;
  ulong *puVar43;
  bool bVar44;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar99 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d19;
  RayQueryContext *local_5d18;
  Geometry *local_5d10;
  undefined4 local_5d04;
  RayK<8> *local_5d00;
  BVH *local_5cf8;
  Intersectors *local_5cf0;
  ulong local_5ce8;
  undefined1 local_5ce0 [32];
  RTCFilterFunctionNArguments local_5cb0;
  undefined1 local_5c80 [32];
  int local_5c60;
  int iStack_5c5c;
  int iStack_5c58;
  int iStack_5c54;
  int iStack_5c50;
  int iStack_5c4c;
  int iStack_5c48;
  int iStack_5c44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c40;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined4 uStack_5b04;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  undefined1 local_5ae0 [32];
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5cf8 = (BVH *)This->ptr;
  local_5808 = (local_5cf8->root).ptr;
  if (local_5808 != 8) {
    auVar50 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar47 = ZEXT816(0) << 0x40;
    uVar45 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar47),5);
    uVar42 = vpcmpeqd_avx512vl(auVar50,(undefined1  [32])valid_i->field_0);
    uVar45 = uVar45 & uVar42;
    bVar39 = (byte)uVar45;
    if (bVar39 != 0) {
      local_5c40._0_4_ = *(undefined4 *)ray;
      local_5c40._4_4_ = *(undefined4 *)(ray + 4);
      local_5c40._8_4_ = *(undefined4 *)(ray + 8);
      local_5c40._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5c40._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5c40._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5c40._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5c40._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5c40._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5c40._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5c40._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5c40._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5c40._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5c40._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5c40._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5c40._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5c40._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5c40._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5c40._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5c40._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5c40._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5c40._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5c40._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5c40._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_5be0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5ba0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar53._8_4_ = 0x7fffffff;
      auVar53._0_8_ = 0x7fffffff7fffffff;
      auVar53._12_4_ = 0x7fffffff;
      auVar53._16_4_ = 0x7fffffff;
      auVar53._20_4_ = 0x7fffffff;
      auVar53._24_4_ = 0x7fffffff;
      auVar53._28_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar53,local_5be0);
      auVar48._8_4_ = 0x219392ef;
      auVar48._0_8_ = 0x219392ef219392ef;
      auVar48._12_4_ = 0x219392ef;
      auVar48._16_4_ = 0x219392ef;
      auVar48._20_4_ = 0x219392ef;
      auVar48._24_4_ = 0x219392ef;
      auVar48._28_4_ = 0x219392ef;
      uVar42 = vcmpps_avx512vl(auVar50,auVar48,1);
      bVar44 = (bool)((byte)uVar42 & 1);
      auVar49._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._0_4_;
      bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._4_4_;
      bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._8_4_;
      bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._12_4_;
      bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
      auVar49._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._16_4_;
      bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
      auVar49._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._20_4_;
      bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
      auVar49._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._24_4_;
      bVar44 = SUB81(uVar42 >> 7,0);
      auVar49._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5be0._28_4_;
      auVar50 = vandps_avx(auVar53,local_5bc0);
      uVar42 = vcmpps_avx512vl(auVar50,auVar48,1);
      bVar44 = (bool)((byte)uVar42 & 1);
      auVar51._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._0_4_;
      bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._4_4_;
      bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._8_4_;
      bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._12_4_;
      bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._16_4_;
      bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._20_4_;
      bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._24_4_;
      bVar44 = SUB81(uVar42 >> 7,0);
      auVar51._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5bc0._28_4_;
      auVar50 = vandps_avx(auVar53,local_5ba0);
      uVar42 = vcmpps_avx512vl(auVar50,auVar48,1);
      bVar44 = (bool)((byte)uVar42 & 1);
      auVar50._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._0_4_;
      bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._4_4_;
      bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._8_4_;
      bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._12_4_;
      bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._16_4_;
      bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._20_4_;
      bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._24_4_;
      bVar44 = SUB81(uVar42 >> 7,0);
      auVar50._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_5ba0._28_4_;
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar52._16_4_ = 0x3f800000;
      auVar52._20_4_ = 0x3f800000;
      auVar52._24_4_ = 0x3f800000;
      auVar52._28_4_ = 0x3f800000;
      auVar48 = vrcp14ps_avx512vl(auVar49);
      auVar14 = vfnmadd213ps_fma(auVar49,auVar48,auVar52);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar48,auVar48);
      auVar49 = vrcp14ps_avx512vl(auVar51);
      auVar15 = vfnmadd213ps_fma(auVar51,auVar49,auVar52);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar49,auVar49);
      auVar49 = vrcp14ps_avx512vl(auVar50);
      auVar16 = vfnmadd213ps_fma(auVar50,auVar49,auVar52);
      local_5b80 = ZEXT1632(auVar14);
      local_5b60 = ZEXT1632(auVar15);
      auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar49,auVar49);
      local_5b40 = ZEXT1632(auVar16);
      local_5b20 = (float)local_5c40._0_4_ * auVar14._0_4_;
      fStack_5b1c = (float)local_5c40._4_4_ * auVar14._4_4_;
      fStack_5b18 = (float)local_5c40._8_4_ * auVar14._8_4_;
      fStack_5b14 = (float)local_5c40._12_4_ * auVar14._12_4_;
      fStack_5b10 = (float)local_5c40._16_4_ * 0.0;
      fStack_5b0c = (float)local_5c40._20_4_ * 0.0;
      fStack_5b08 = (float)local_5c40._24_4_ * 0.0;
      local_5b00 = (float)local_5c40._32_4_ * auVar15._0_4_;
      fStack_5afc = (float)local_5c40._36_4_ * auVar15._4_4_;
      fStack_5af8 = (float)local_5c40._40_4_ * auVar15._8_4_;
      fStack_5af4 = (float)local_5c40._44_4_ * auVar15._12_4_;
      fStack_5af0 = (float)local_5c40._48_4_ * 0.0;
      fStack_5aec = (float)local_5c40._52_4_ * 0.0;
      fStack_5ae8 = (float)local_5c40._56_4_ * 0.0;
      local_5ae0._4_4_ = (float)local_5c40._68_4_ * auVar16._4_4_;
      local_5ae0._0_4_ = (float)local_5c40._64_4_ * auVar16._0_4_;
      local_5ae0._8_4_ = (float)local_5c40._72_4_ * auVar16._8_4_;
      local_5ae0._12_4_ = (float)local_5c40._76_4_ * auVar16._12_4_;
      local_5ae0._16_4_ = (float)local_5c40._80_4_ * 0.0;
      local_5ae0._20_4_ = (float)local_5c40._84_4_ * 0.0;
      local_5ae0._24_4_ = (float)local_5c40._88_4_ * 0.0;
      local_5ae0._28_4_ = local_5c40._92_4_;
      uVar42 = vcmpps_avx512vl(ZEXT1632(auVar14),ZEXT1632(auVar47),1);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5ac0 = (uint)((byte)uVar42 & 1) * auVar50._0_4_;
      iStack_5abc = (uint)((byte)(uVar42 >> 1) & 1) * auVar50._4_4_;
      iStack_5ab8 = (uint)((byte)(uVar42 >> 2) & 1) * auVar50._8_4_;
      iStack_5ab4 = (uint)((byte)(uVar42 >> 3) & 1) * auVar50._12_4_;
      iStack_5ab0 = (uint)((byte)(uVar42 >> 4) & 1) * auVar50._16_4_;
      iStack_5aac = (uint)((byte)(uVar42 >> 5) & 1) * auVar50._20_4_;
      iStack_5aa8 = (uint)((byte)(uVar42 >> 6) & 1) * auVar50._24_4_;
      iStack_5aa4 = (uint)(byte)(uVar42 >> 7) * auVar50._28_4_;
      auVar49 = ZEXT1632(auVar47);
      uVar42 = vcmpps_avx512vl(ZEXT1632(auVar15),auVar49,5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar44 = (bool)((byte)uVar42 & 1);
      local_5aa0 = (uint)bVar44 * auVar50._0_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
      uStack_5a9c = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
      uStack_5a98 = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
      uStack_5a94 = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
      uStack_5a90 = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
      uStack_5a8c = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * 0x60;
      bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
      uStack_5a88 = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * 0x60;
      bVar44 = SUB81(uVar42 >> 7,0);
      uStack_5a84 = (uint)bVar44 * auVar50._28_4_ | (uint)!bVar44 * 0x60;
      uVar42 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar49,5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar44 = (bool)((byte)uVar42 & 1);
      local_5a80 = (uint)bVar44 * auVar50._0_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
      uStack_5a7c = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
      uStack_5a78 = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
      uStack_5a74 = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
      uStack_5a70 = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
      uStack_5a6c = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
      uStack_5a68 = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * 0xa0;
      bVar44 = SUB81(uVar42 >> 7,0);
      uStack_5a64 = (uint)bVar44 * auVar50._28_4_ | (uint)!bVar44 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = ZEXT3264(local_4680);
      local_5d04 = (undefined4)uVar45;
      auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar49);
      local_5a60._0_4_ =
           (uint)(bVar39 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar39 & 1) * local_4680._0_4_;
      bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
      local_5a60._4_4_ = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * local_4680._4_4_;
      bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
      local_5a60._8_4_ = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * local_4680._8_4_;
      bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
      local_5a60._12_4_ = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * local_4680._12_4_;
      bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
      local_5a60._16_4_ = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * local_4680._16_4_;
      bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
      local_5a60._20_4_ = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * local_4680._20_4_;
      bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
      local_5a60._24_4_ = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * local_4680._24_4_;
      bVar44 = SUB81(uVar45 >> 7,0);
      local_5a60._28_4_ = (uint)bVar44 * auVar50._28_4_ | (uint)!bVar44 * local_4680._28_4_;
      auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar49);
      local_5a40._0_4_ = (uint)(bVar39 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar39 & 1) * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
      local_5a40._4_4_ = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
      local_5a40._8_4_ = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
      local_5a40._12_4_ = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
      local_5a40._16_4_ = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
      local_5a40._20_4_ = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
      local_5a40._24_4_ = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = SUB81(uVar45 >> 7,0);
      local_5a40._28_4_ = (uint)bVar44 * auVar50._28_4_ | (uint)!bVar44 * -0x800000;
      bVar39 = ~bVar39;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 7;
      }
      else {
        uVar40 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5d00 = ray + 0x100;
      puVar43 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar38 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5a60;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar98 = ZEXT3264(auVar50);
      auVar47 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar99 = ZEXT1664(auVar47);
      local_5d18 = context;
      local_5cf0 = This;
      uStack_5b04 = local_5c40._28_4_;
      uStack_5ae4 = local_5c40._60_4_;
LAB_01f59861:
      do {
        do {
          root.ptr = puVar43[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5a1cb;
          puVar43 = puVar43 + -1;
          pauVar38 = pauVar38 + -1;
          auVar50 = *pauVar38;
          auVar96 = ZEXT3264(auVar50);
          uVar45 = vcmpps_avx512vl(auVar50,local_5a40,1);
        } while ((char)uVar45 == '\0');
        uVar41 = (undefined4)uVar45;
        if (uVar40 < (uint)POPCOUNT(uVar41)) {
LAB_01f598a2:
          do {
            uVar86 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5a1cb;
              uVar10 = vcmpps_avx512vl(auVar96._0_32_,local_5a40,9);
              if ((char)uVar10 == '\0') goto LAB_01f59861;
              local_5ce8 = (ulong)(uVar86 & 0xf) - 8;
              bVar33 = bVar39;
              if (local_5ce8 == 0) goto LAB_01f5a0b7;
              bVar33 = ~bVar39;
              lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar45 = 0;
              goto LAB_01f59af3;
            }
            uVar45 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar37 = -0x20;
            auVar50 = auVar97._0_32_;
            do {
              uVar42 = *(ulong *)(uVar45 + 0x40 + lVar37 * 2);
              if (uVar42 == 8) break;
              uVar41 = *(undefined4 *)(uVar45 + 0x120 + lVar37);
              auVar75._4_4_ = uVar41;
              auVar75._0_4_ = uVar41;
              auVar75._8_4_ = uVar41;
              auVar75._12_4_ = uVar41;
              auVar75._16_4_ = uVar41;
              auVar75._20_4_ = uVar41;
              auVar75._24_4_ = uVar41;
              auVar75._28_4_ = uVar41;
              auVar49 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar41 = *(undefined4 *)(uVar45 + 0x60 + lVar37);
              auVar17._4_4_ = uVar41;
              auVar17._0_4_ = uVar41;
              auVar17._8_4_ = uVar41;
              auVar17._12_4_ = uVar41;
              auVar17._16_4_ = uVar41;
              auVar17._20_4_ = uVar41;
              auVar17._24_4_ = uVar41;
              auVar17._28_4_ = uVar41;
              auVar51 = vfmadd213ps_avx512vl(auVar75,auVar49,auVar17);
              uVar41 = *(undefined4 *)(uVar45 + 0x160 + lVar37);
              auVar76._4_4_ = uVar41;
              auVar76._0_4_ = uVar41;
              auVar76._8_4_ = uVar41;
              auVar76._12_4_ = uVar41;
              auVar76._16_4_ = uVar41;
              auVar76._20_4_ = uVar41;
              auVar76._24_4_ = uVar41;
              auVar76._28_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar45 + 0xa0 + lVar37);
              auVar18._4_4_ = uVar41;
              auVar18._0_4_ = uVar41;
              auVar18._8_4_ = uVar41;
              auVar18._12_4_ = uVar41;
              auVar18._16_4_ = uVar41;
              auVar18._20_4_ = uVar41;
              auVar18._24_4_ = uVar41;
              auVar18._28_4_ = uVar41;
              auVar48 = vfmadd213ps_avx512vl(auVar76,auVar49,auVar18);
              uVar41 = *(undefined4 *)(uVar45 + 0x1a0 + lVar37);
              auVar79._4_4_ = uVar41;
              auVar79._0_4_ = uVar41;
              auVar79._8_4_ = uVar41;
              auVar79._12_4_ = uVar41;
              auVar79._16_4_ = uVar41;
              auVar79._20_4_ = uVar41;
              auVar79._24_4_ = uVar41;
              auVar79._28_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar45 + 0xe0 + lVar37);
              auVar19._4_4_ = uVar41;
              auVar19._0_4_ = uVar41;
              auVar19._8_4_ = uVar41;
              auVar19._12_4_ = uVar41;
              auVar19._16_4_ = uVar41;
              auVar19._20_4_ = uVar41;
              auVar19._24_4_ = uVar41;
              auVar19._28_4_ = uVar41;
              auVar52 = vfmadd213ps_avx512vl(auVar79,auVar49,auVar19);
              uVar41 = *(undefined4 *)(uVar45 + 0x140 + lVar37);
              auVar80._4_4_ = uVar41;
              auVar80._0_4_ = uVar41;
              auVar80._8_4_ = uVar41;
              auVar80._12_4_ = uVar41;
              auVar80._16_4_ = uVar41;
              auVar80._20_4_ = uVar41;
              auVar80._24_4_ = uVar41;
              auVar80._28_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar45 + 0x80 + lVar37);
              auVar20._4_4_ = uVar41;
              auVar20._0_4_ = uVar41;
              auVar20._8_4_ = uVar41;
              auVar20._12_4_ = uVar41;
              auVar20._16_4_ = uVar41;
              auVar20._20_4_ = uVar41;
              auVar20._24_4_ = uVar41;
              auVar20._28_4_ = uVar41;
              auVar53 = vfmadd213ps_avx512vl(auVar80,auVar49,auVar20);
              uVar41 = *(undefined4 *)(uVar45 + 0x180 + lVar37);
              auVar82._4_4_ = uVar41;
              auVar82._0_4_ = uVar41;
              auVar82._8_4_ = uVar41;
              auVar82._12_4_ = uVar41;
              auVar82._16_4_ = uVar41;
              auVar82._20_4_ = uVar41;
              auVar82._24_4_ = uVar41;
              auVar82._28_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar45 + 0xc0 + lVar37);
              auVar21._4_4_ = uVar41;
              auVar21._0_4_ = uVar41;
              auVar21._8_4_ = uVar41;
              auVar21._12_4_ = uVar41;
              auVar21._16_4_ = uVar41;
              auVar21._20_4_ = uVar41;
              auVar21._24_4_ = uVar41;
              auVar21._28_4_ = uVar41;
              auVar54 = vfmadd213ps_avx512vl(auVar82,auVar49,auVar21);
              uVar41 = *(undefined4 *)(uVar45 + 0x1c0 + lVar37);
              auVar84._4_4_ = uVar41;
              auVar84._0_4_ = uVar41;
              auVar84._8_4_ = uVar41;
              auVar84._12_4_ = uVar41;
              auVar84._16_4_ = uVar41;
              auVar84._20_4_ = uVar41;
              auVar84._24_4_ = uVar41;
              auVar84._28_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar45 + 0x100 + lVar37);
              auVar22._4_4_ = uVar41;
              auVar22._0_4_ = uVar41;
              auVar22._8_4_ = uVar41;
              auVar22._12_4_ = uVar41;
              auVar22._16_4_ = uVar41;
              auVar22._20_4_ = uVar41;
              auVar22._24_4_ = uVar41;
              auVar22._28_4_ = uVar41;
              auVar55 = vfmadd213ps_avx512vl(auVar84,auVar49,auVar22);
              auVar31._4_4_ = fStack_5b1c;
              auVar31._0_4_ = local_5b20;
              auVar31._8_4_ = fStack_5b18;
              auVar31._12_4_ = fStack_5b14;
              auVar31._16_4_ = fStack_5b10;
              auVar31._20_4_ = fStack_5b0c;
              auVar31._24_4_ = fStack_5b08;
              auVar31._28_4_ = uStack_5b04;
              auVar47 = vfmsub213ps_fma(auVar51,local_5b80,auVar31);
              auVar32._4_4_ = fStack_5afc;
              auVar32._0_4_ = local_5b00;
              auVar32._8_4_ = fStack_5af8;
              auVar32._12_4_ = fStack_5af4;
              auVar32._16_4_ = fStack_5af0;
              auVar32._20_4_ = fStack_5aec;
              auVar32._24_4_ = fStack_5ae8;
              auVar32._28_4_ = uStack_5ae4;
              auVar14 = vfmsub213ps_fma(auVar48,local_5b60,auVar32);
              auVar15 = vfmsub213ps_fma(auVar52,local_5b40,local_5ae0);
              auVar16 = vfmsub213ps_fma(auVar53,local_5b80,auVar31);
              auVar12 = vfmsub213ps_fma(auVar54,local_5b60,auVar32);
              auVar13 = vfmsub213ps_fma(auVar55,local_5b40,local_5ae0);
              auVar51 = vpminsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar16));
              auVar48 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar12));
              auVar51 = vpmaxsd_avx2(auVar51,auVar48);
              auVar48 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar13));
              auVar51 = vpmaxsd_avx2(auVar51,auVar48);
              auVar48 = vpmaxsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar16));
              auVar52 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar12));
              auVar52 = vpminsd_avx2(auVar48,auVar52);
              auVar48 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar13));
              auVar52 = vpminsd_avx2(auVar52,auVar48);
              auVar48 = vpmaxsd_avx2(auVar51,local_5a60);
              auVar52 = vpminsd_avx2(auVar52,local_5a40);
              uVar46 = vcmpps_avx512vl(auVar48,auVar52,2);
              if ((uVar86 & 7) == 6) {
                uVar41 = *(undefined4 *)(uVar45 + 0x1e0 + lVar37);
                auVar23._4_4_ = uVar41;
                auVar23._0_4_ = uVar41;
                auVar23._8_4_ = uVar41;
                auVar23._12_4_ = uVar41;
                auVar23._16_4_ = uVar41;
                auVar23._20_4_ = uVar41;
                auVar23._24_4_ = uVar41;
                auVar23._28_4_ = uVar41;
                uVar8 = vcmpps_avx512vl(auVar49,auVar23,0xd);
                uVar41 = *(undefined4 *)(uVar45 + 0x200 + lVar37);
                auVar24._4_4_ = uVar41;
                auVar24._0_4_ = uVar41;
                auVar24._8_4_ = uVar41;
                auVar24._12_4_ = uVar41;
                auVar24._16_4_ = uVar41;
                auVar24._20_4_ = uVar41;
                auVar24._24_4_ = uVar41;
                auVar24._28_4_ = uVar41;
                uVar9 = vcmpps_avx512vl(auVar49,auVar24,1);
                uVar46 = uVar46 & uVar8 & uVar9;
              }
              uVar8 = vcmpps_avx512vl(local_5a40,auVar96._0_32_,6);
              uVar46 = uVar46 & uVar8;
              uVar8 = root.ptr;
              auVar56 = auVar50;
              if ((byte)uVar46 != 0) {
                auVar51 = vblendmps_avx512vl(auVar97._0_32_,auVar51);
                bVar44 = (bool)((byte)uVar46 & 1);
                auVar56._0_4_ = (uint)bVar44 * auVar51._0_4_ | (uint)!bVar44 * auVar49._0_4_;
                bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar44 * auVar51._4_4_ | (uint)!bVar44 * auVar49._4_4_;
                bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar44 * auVar51._8_4_ | (uint)!bVar44 * auVar49._8_4_;
                bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
                auVar56._12_4_ = (uint)bVar44 * auVar51._12_4_ | (uint)!bVar44 * auVar49._12_4_;
                bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
                auVar56._16_4_ = (uint)bVar44 * auVar51._16_4_ | (uint)!bVar44 * auVar49._16_4_;
                bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
                auVar56._20_4_ = (uint)bVar44 * auVar51._20_4_ | (uint)!bVar44 * auVar49._20_4_;
                bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
                auVar56._24_4_ = (uint)bVar44 * auVar51._24_4_ | (uint)!bVar44 * auVar49._24_4_;
                bVar44 = SUB81(uVar46 >> 7,0);
                auVar56._28_4_ = (uint)bVar44 * auVar51._28_4_ | (uint)!bVar44 * auVar49._28_4_;
                uVar8 = uVar42;
                if (root.ptr != 8) {
                  *puVar43 = root.ptr;
                  puVar43 = puVar43 + 1;
                  *pauVar38 = auVar50;
                  pauVar38 = pauVar38 + 1;
                }
              }
              auVar50 = auVar56;
              root.ptr = uVar8;
              lVar37 = lVar37 + 4;
            } while (lVar37 != 0);
            iVar35 = 4;
            if (root.ptr == 8) goto LAB_01f59a99;
            uVar10 = vcmpps_avx512vl(auVar50,local_5a40,9);
            auVar96 = ZEXT3264(auVar50);
          } while ((byte)uVar40 < (byte)POPCOUNT((int)uVar10));
          *puVar43 = root.ptr;
          puVar43 = puVar43 + 1;
          *pauVar38 = auVar50;
          pauVar38 = pauVar38 + 1;
        }
        else {
          do {
            local_5ce0 = auVar50;
            local_5d10 = (Geometry *)0x0;
            for (uVar42 = uVar45; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              local_5d10 = (Geometry *)((long)local_5d10 + 1);
            }
            bVar44 = occluded1(local_5cf0,local_5cf8,root,(size_t)local_5d10,&local_5d19,ray,
                               (TravRayK<8,_false> *)&local_5c40.field_0,context);
            bVar33 = (byte)(1 << ((uint)local_5d10 & 0x1f));
            if (!bVar44) {
              bVar33 = 0;
            }
            bVar39 = bVar39 | bVar33;
            uVar45 = uVar45 - 1 & uVar45;
            context = local_5d18;
            auVar50 = local_5ce0;
          } while (uVar45 != 0);
          if (bVar39 == 0xff) {
            iVar35 = 3;
          }
          else {
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_5a40._0_4_ =
                 (uint)(bVar39 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar39 & 1) * local_5a40._0_4_;
            bVar44 = (bool)(bVar39 >> 1 & 1);
            local_5a40._4_4_ = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * local_5a40._4_4_;
            bVar44 = (bool)(bVar39 >> 2 & 1);
            local_5a40._8_4_ = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * local_5a40._8_4_;
            bVar44 = (bool)(bVar39 >> 3 & 1);
            local_5a40._12_4_ = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * local_5a40._12_4_;
            bVar44 = (bool)(bVar39 >> 4 & 1);
            local_5a40._16_4_ = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * local_5a40._16_4_;
            bVar44 = (bool)(bVar39 >> 5 & 1);
            local_5a40._20_4_ = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * local_5a40._20_4_;
            bVar44 = (bool)(bVar39 >> 6 & 1);
            local_5a40._24_4_ = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * local_5a40._24_4_;
            local_5a40._28_4_ =
                 (uint)(bVar39 >> 7) * auVar50._28_4_ |
                 (uint)!(bool)(bVar39 >> 7) * local_5a40._28_4_;
            iVar35 = 2;
          }
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar97 = ZEXT3264(auVar50);
          auVar96 = ZEXT3264(local_5ce0);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar98 = ZEXT3264(auVar50);
          auVar47 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar99 = ZEXT1664(auVar47);
          if (uVar40 < (uint)POPCOUNT(uVar41)) goto LAB_01f598a2;
        }
LAB_01f59a99:
      } while ((iVar35 == 4) || (iVar35 == 2));
LAB_01f5a1cb:
      bVar39 = bVar39 & (byte)local_5d04;
      bVar44 = (bool)(bVar39 >> 1 & 1);
      bVar2 = (bool)(bVar39 >> 2 & 1);
      bVar3 = (bool)(bVar39 >> 3 & 1);
      bVar4 = (bool)(bVar39 >> 4 & 1);
      bVar5 = (bool)(bVar39 >> 5 & 1);
      bVar6 = (bool)(bVar39 >> 6 & 1);
      *(uint *)local_5d00 =
           (uint)(bVar39 & 1) * -0x800000 | (uint)!(bool)(bVar39 & 1) * *(int *)local_5d00;
      *(uint *)(local_5d00 + 4) =
           (uint)bVar44 * -0x800000 | (uint)!bVar44 * *(int *)(local_5d00 + 4);
      *(uint *)(local_5d00 + 8) = (uint)bVar2 * -0x800000 | (uint)!bVar2 * *(int *)(local_5d00 + 8);
      *(uint *)(local_5d00 + 0xc) =
           (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(local_5d00 + 0xc);
      *(uint *)(local_5d00 + 0x10) =
           (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5d00 + 0x10);
      *(uint *)(local_5d00 + 0x14) =
           (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5d00 + 0x14);
      *(uint *)(local_5d00 + 0x18) =
           (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5d00 + 0x18);
      *(uint *)(local_5d00 + 0x1c) =
           (uint)(bVar39 >> 7) * -0x800000 |
           (uint)!(bool)(bVar39 >> 7) * *(int *)(local_5d00 + 0x1c);
    }
  }
  return;
  while( true ) {
    uVar45 = uVar45 + 1;
    lVar37 = lVar37 + 0x140;
    if (local_5ce8 <= uVar45) break;
LAB_01f59af3:
    uVar42 = 0;
    bVar34 = bVar33;
    while (uVar46 = (ulong)*(uint *)(lVar37 + -0x10 + uVar42 * 4), uVar46 != 0xffffffff) {
      auVar50 = *(undefined1 (*) [32])(ray + 0x80);
      auVar49 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar48 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar41 = *(undefined4 *)(lVar37 + -0xa0 + uVar42 * 4);
      auVar73._4_4_ = uVar41;
      auVar73._0_4_ = uVar41;
      auVar73._8_4_ = uVar41;
      auVar73._12_4_ = uVar41;
      auVar73._16_4_ = uVar41;
      auVar73._20_4_ = uVar41;
      auVar73._24_4_ = uVar41;
      auVar73._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x90 + uVar42 * 4);
      auVar77._4_4_ = uVar41;
      auVar77._0_4_ = uVar41;
      auVar77._8_4_ = uVar41;
      auVar77._12_4_ = uVar41;
      auVar77._16_4_ = uVar41;
      auVar77._20_4_ = uVar41;
      auVar77._24_4_ = uVar41;
      auVar77._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x80 + uVar42 * 4);
      auVar81._4_4_ = uVar41;
      auVar81._0_4_ = uVar41;
      auVar81._8_4_ = uVar41;
      auVar81._12_4_ = uVar41;
      auVar81._16_4_ = uVar41;
      auVar81._20_4_ = uVar41;
      auVar81._24_4_ = uVar41;
      auVar81._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x130 + uVar42 * 4);
      auVar54._4_4_ = uVar41;
      auVar54._0_4_ = uVar41;
      auVar54._8_4_ = uVar41;
      auVar54._12_4_ = uVar41;
      auVar54._16_4_ = uVar41;
      auVar54._20_4_ = uVar41;
      auVar54._24_4_ = uVar41;
      auVar54._28_4_ = uVar41;
      auVar57 = vfmadd213ps_avx512vl(auVar73,auVar48,auVar54);
      uVar41 = *(undefined4 *)(lVar37 + -0x120 + uVar42 * 4);
      auVar55._4_4_ = uVar41;
      auVar55._0_4_ = uVar41;
      auVar55._8_4_ = uVar41;
      auVar55._12_4_ = uVar41;
      auVar55._16_4_ = uVar41;
      auVar55._20_4_ = uVar41;
      auVar55._24_4_ = uVar41;
      auVar55._28_4_ = uVar41;
      auVar58 = vfmadd213ps_avx512vl(auVar77,auVar48,auVar55);
      uVar41 = *(undefined4 *)(lVar37 + -0x110 + uVar42 * 4);
      auVar65._4_4_ = uVar41;
      auVar65._0_4_ = uVar41;
      auVar65._8_4_ = uVar41;
      auVar65._12_4_ = uVar41;
      auVar65._16_4_ = uVar41;
      auVar65._20_4_ = uVar41;
      auVar65._24_4_ = uVar41;
      auVar65._28_4_ = uVar41;
      auVar59 = vfmadd213ps_avx512vl(auVar81,auVar48,auVar65);
      uVar41 = *(undefined4 *)(lVar37 + -0x70 + uVar42 * 4);
      auVar64._4_4_ = uVar41;
      auVar64._0_4_ = uVar41;
      auVar64._8_4_ = uVar41;
      auVar64._12_4_ = uVar41;
      auVar64._16_4_ = uVar41;
      auVar64._20_4_ = uVar41;
      auVar64._24_4_ = uVar41;
      auVar64._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x60 + uVar42 * 4);
      auVar72._4_4_ = uVar41;
      auVar72._0_4_ = uVar41;
      auVar72._8_4_ = uVar41;
      auVar72._12_4_ = uVar41;
      auVar72._16_4_ = uVar41;
      auVar72._20_4_ = uVar41;
      auVar72._24_4_ = uVar41;
      auVar72._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x50 + uVar42 * 4);
      auVar85._4_4_ = uVar41;
      auVar85._0_4_ = uVar41;
      auVar85._8_4_ = uVar41;
      auVar85._12_4_ = uVar41;
      auVar85._16_4_ = uVar41;
      auVar85._20_4_ = uVar41;
      auVar85._24_4_ = uVar41;
      auVar85._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x100 + uVar42 * 4);
      auVar7._4_4_ = uVar41;
      auVar7._0_4_ = uVar41;
      auVar7._8_4_ = uVar41;
      auVar7._12_4_ = uVar41;
      auVar7._16_4_ = uVar41;
      auVar7._20_4_ = uVar41;
      auVar7._24_4_ = uVar41;
      auVar7._28_4_ = uVar41;
      auVar55 = vfmadd213ps_avx512vl(auVar64,auVar48,auVar7);
      uVar41 = *(undefined4 *)(lVar37 + -0xf0 + uVar42 * 4);
      auVar67._4_4_ = uVar41;
      auVar67._0_4_ = uVar41;
      auVar67._8_4_ = uVar41;
      auVar67._12_4_ = uVar41;
      auVar67._16_4_ = uVar41;
      auVar67._20_4_ = uVar41;
      auVar67._24_4_ = uVar41;
      auVar67._28_4_ = uVar41;
      auVar52 = vfmadd213ps_avx512vl(auVar72,auVar48,auVar67);
      uVar41 = *(undefined4 *)(lVar37 + -0xe0 + uVar42 * 4);
      auVar66._4_4_ = uVar41;
      auVar66._0_4_ = uVar41;
      auVar66._8_4_ = uVar41;
      auVar66._12_4_ = uVar41;
      auVar66._16_4_ = uVar41;
      auVar66._20_4_ = uVar41;
      auVar66._24_4_ = uVar41;
      auVar66._28_4_ = uVar41;
      auVar53 = vfmadd213ps_avx512vl(auVar85,auVar48,auVar66);
      uVar41 = *(undefined4 *)(lVar37 + -0x40 + uVar42 * 4);
      auVar93._4_4_ = uVar41;
      auVar93._0_4_ = uVar41;
      auVar93._8_4_ = uVar41;
      auVar93._12_4_ = uVar41;
      auVar93._16_4_ = uVar41;
      auVar93._20_4_ = uVar41;
      auVar93._24_4_ = uVar41;
      auVar93._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x30 + uVar42 * 4);
      auVar94._4_4_ = uVar41;
      auVar94._0_4_ = uVar41;
      auVar94._8_4_ = uVar41;
      auVar94._12_4_ = uVar41;
      auVar94._16_4_ = uVar41;
      auVar94._20_4_ = uVar41;
      auVar94._24_4_ = uVar41;
      auVar94._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0x20 + uVar42 * 4);
      auVar95._4_4_ = uVar41;
      auVar95._0_4_ = uVar41;
      auVar95._8_4_ = uVar41;
      auVar95._12_4_ = uVar41;
      auVar95._16_4_ = uVar41;
      auVar95._20_4_ = uVar41;
      auVar95._24_4_ = uVar41;
      auVar95._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0xd0 + uVar42 * 4);
      auVar60._4_4_ = uVar41;
      auVar60._0_4_ = uVar41;
      auVar60._8_4_ = uVar41;
      auVar60._12_4_ = uVar41;
      auVar60._16_4_ = uVar41;
      auVar60._20_4_ = uVar41;
      auVar60._24_4_ = uVar41;
      auVar60._28_4_ = uVar41;
      auVar60 = vfmadd213ps_avx512vl(auVar93,auVar48,auVar60);
      uVar41 = *(undefined4 *)(lVar37 + -0xc0 + uVar42 * 4);
      auVar61._4_4_ = uVar41;
      auVar61._0_4_ = uVar41;
      auVar61._8_4_ = uVar41;
      auVar61._12_4_ = uVar41;
      auVar61._16_4_ = uVar41;
      auVar61._20_4_ = uVar41;
      auVar61._24_4_ = uVar41;
      auVar61._28_4_ = uVar41;
      auVar61 = vfmadd213ps_avx512vl(auVar94,auVar48,auVar61);
      uVar41 = *(undefined4 *)(lVar37 + -0xb0 + uVar42 * 4);
      auVar62._4_4_ = uVar41;
      auVar62._0_4_ = uVar41;
      auVar62._8_4_ = uVar41;
      auVar62._12_4_ = uVar41;
      auVar62._16_4_ = uVar41;
      auVar62._20_4_ = uVar41;
      auVar62._24_4_ = uVar41;
      auVar62._28_4_ = uVar41;
      auVar62 = vfmadd213ps_avx512vl(auVar95,auVar48,auVar62);
      auVar48 = vsubps_avx(auVar57,auVar55);
      auVar52 = vsubps_avx(auVar58,auVar52);
      auVar53 = vsubps_avx(auVar59,auVar53);
      auVar54 = vsubps_avx(auVar60,auVar57);
      auVar63 = vsubps_avx512vl(auVar61,auVar58);
      auVar64 = vsubps_avx512vl(auVar62,auVar59);
      auVar65 = vmulps_avx512vl(auVar52,auVar64);
      auVar66 = vfmsub231ps_avx512vl(auVar65,auVar63,auVar53);
      auVar68._4_4_ = auVar53._4_4_ * auVar54._4_4_;
      auVar68._0_4_ = auVar53._0_4_ * auVar54._0_4_;
      auVar68._8_4_ = auVar53._8_4_ * auVar54._8_4_;
      auVar68._12_4_ = auVar53._12_4_ * auVar54._12_4_;
      auVar68._16_4_ = auVar53._16_4_ * auVar54._16_4_;
      auVar68._20_4_ = auVar53._20_4_ * auVar54._20_4_;
      auVar68._24_4_ = auVar53._24_4_ * auVar54._24_4_;
      auVar68._28_4_ = auVar55._28_4_;
      auVar67 = vfmsub231ps_avx512vl(auVar68,auVar64,auVar48);
      auVar68 = vmulps_avx512vl(auVar48,auVar63);
      auVar15 = vfmsub231ps_fma(auVar68,auVar54,auVar52);
      auVar55 = vsubps_avx(auVar57,*(undefined1 (*) [32])ray);
      auVar65 = vsubps_avx(auVar58,*(undefined1 (*) [32])(ray + 0x20));
      auVar7 = vsubps_avx(auVar59,*(undefined1 (*) [32])(ray + 0x40));
      auVar57._4_4_ = auVar49._4_4_ * auVar7._4_4_;
      auVar57._0_4_ = auVar49._0_4_ * auVar7._0_4_;
      auVar57._8_4_ = auVar49._8_4_ * auVar7._8_4_;
      auVar57._12_4_ = auVar49._12_4_ * auVar7._12_4_;
      auVar57._16_4_ = auVar49._16_4_ * auVar7._16_4_;
      auVar57._20_4_ = auVar49._20_4_ * auVar7._20_4_;
      auVar57._24_4_ = auVar49._24_4_ * auVar7._24_4_;
      auVar57._28_4_ = auVar60._28_4_;
      auVar16 = vfmsub231ps_fma(auVar57,auVar65,auVar51);
      auVar58._4_4_ = auVar51._4_4_ * auVar55._4_4_;
      auVar58._0_4_ = auVar51._0_4_ * auVar55._0_4_;
      auVar58._8_4_ = auVar51._8_4_ * auVar55._8_4_;
      auVar58._12_4_ = auVar51._12_4_ * auVar55._12_4_;
      auVar58._16_4_ = auVar51._16_4_ * auVar55._16_4_;
      auVar58._20_4_ = auVar51._20_4_ * auVar55._20_4_;
      auVar58._24_4_ = auVar51._24_4_ * auVar55._24_4_;
      auVar58._28_4_ = auVar61._28_4_;
      auVar12 = vfmsub231ps_fma(auVar58,auVar7,auVar50);
      auVar59._4_4_ = auVar50._4_4_ * auVar65._4_4_;
      auVar59._0_4_ = auVar50._0_4_ * auVar65._0_4_;
      auVar59._8_4_ = auVar50._8_4_ * auVar65._8_4_;
      auVar59._12_4_ = auVar50._12_4_ * auVar65._12_4_;
      auVar59._16_4_ = auVar50._16_4_ * auVar65._16_4_;
      auVar59._20_4_ = auVar50._20_4_ * auVar65._20_4_;
      auVar59._24_4_ = auVar50._24_4_ * auVar65._24_4_;
      auVar59._28_4_ = auVar62._28_4_;
      auVar13 = vfmsub231ps_fma(auVar59,auVar55,auVar49);
      auVar27._4_4_ = auVar15._4_4_ * auVar51._4_4_;
      auVar27._0_4_ = auVar15._0_4_ * auVar51._0_4_;
      auVar27._8_4_ = auVar15._8_4_ * auVar51._8_4_;
      auVar27._12_4_ = auVar15._12_4_ * auVar51._12_4_;
      auVar27._16_4_ = auVar51._16_4_ * 0.0;
      auVar27._20_4_ = auVar51._20_4_ * 0.0;
      auVar27._24_4_ = auVar51._24_4_ * 0.0;
      auVar27._28_4_ = auVar51._28_4_;
      auVar47 = vfmadd231ps_fma(auVar27,auVar67,auVar49);
      auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar66,auVar50);
      vandps_avx512vl(ZEXT1632(auVar47),auVar98._0_32_);
      auVar50 = vmulps_avx512vl(auVar64,ZEXT1632(auVar13));
      auVar50 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar12),auVar63);
      auVar14 = vfmadd231ps_fma(auVar50,ZEXT1632(auVar16),auVar54);
      uVar86 = auVar68._0_4_;
      auVar63._0_4_ = uVar86 ^ auVar14._0_4_;
      uVar87 = auVar68._4_4_;
      auVar63._4_4_ = uVar87 ^ auVar14._4_4_;
      uVar88 = auVar68._8_4_;
      auVar63._8_4_ = uVar88 ^ auVar14._8_4_;
      uVar89 = auVar68._12_4_;
      auVar63._12_4_ = uVar89 ^ auVar14._12_4_;
      uVar41 = auVar68._16_4_;
      auVar63._16_4_ = uVar41;
      uVar90 = auVar68._20_4_;
      auVar63._20_4_ = uVar90;
      uVar91 = auVar68._24_4_;
      auVar63._24_4_ = uVar91;
      uVar92 = auVar68._28_4_;
      auVar63._28_4_ = uVar92;
      uVar10 = vcmpps_avx512vl(auVar63,auVar99._0_32_,5);
      local_5ce0[0] = bVar34;
      bVar36 = (byte)uVar10 & bVar34;
      if (bVar36 == 0) {
LAB_01f59c6b:
        bVar36 = 0;
      }
      else {
        auVar28._4_4_ = auVar53._4_4_ * auVar13._4_4_;
        auVar28._0_4_ = auVar53._0_4_ * auVar13._0_4_;
        auVar28._8_4_ = auVar53._8_4_ * auVar13._8_4_;
        auVar28._12_4_ = auVar53._12_4_ * auVar13._12_4_;
        auVar28._16_4_ = auVar53._16_4_ * 0.0;
        auVar28._20_4_ = auVar53._20_4_ * 0.0;
        auVar28._24_4_ = auVar53._24_4_ * 0.0;
        auVar28._28_4_ = auVar53._28_4_;
        auVar14 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar52,auVar28);
        auVar14 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar48,ZEXT1632(auVar14));
        auVar83._0_4_ = uVar86 ^ auVar14._0_4_;
        auVar83._4_4_ = uVar87 ^ auVar14._4_4_;
        auVar83._8_4_ = uVar88 ^ auVar14._8_4_;
        auVar83._12_4_ = uVar89 ^ auVar14._12_4_;
        auVar83._16_4_ = uVar41;
        auVar83._20_4_ = uVar90;
        auVar83._24_4_ = uVar91;
        auVar83._28_4_ = uVar92;
        uVar10 = vcmpps_avx512vl(auVar83,auVar99._0_32_,5);
        bVar36 = bVar36 & (byte)uVar10;
        if (bVar36 == 0) goto LAB_01f59c6b;
        auVar26._8_4_ = 0x7fffffff;
        auVar26._0_8_ = 0x7fffffff7fffffff;
        auVar26._12_4_ = 0x7fffffff;
        auVar26._16_4_ = 0x7fffffff;
        auVar26._20_4_ = 0x7fffffff;
        auVar26._24_4_ = 0x7fffffff;
        auVar26._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar47),auVar26);
        auVar49 = vsubps_avx(auVar50,auVar63);
        uVar10 = vcmpps_avx512vl(auVar49,auVar83,5);
        bVar36 = bVar36 & (byte)uVar10;
        if (bVar36 == 0) goto LAB_01f59c6b;
        auVar29._4_4_ = auVar7._4_4_ * auVar15._4_4_;
        auVar29._0_4_ = auVar7._0_4_ * auVar15._0_4_;
        auVar29._8_4_ = auVar7._8_4_ * auVar15._8_4_;
        auVar29._12_4_ = auVar7._12_4_ * auVar15._12_4_;
        auVar29._16_4_ = auVar7._16_4_ * 0.0;
        auVar29._20_4_ = auVar7._20_4_ * 0.0;
        auVar29._24_4_ = auVar7._24_4_ * 0.0;
        auVar29._28_4_ = auVar7._28_4_;
        auVar14 = vfmadd213ps_fma(auVar65,auVar67,auVar29);
        auVar14 = vfmadd213ps_fma(auVar55,auVar66,ZEXT1632(auVar14));
        auVar78._0_4_ = auVar50._0_4_ * *(float *)(ray + 0x60);
        auVar78._4_4_ = auVar50._4_4_ * *(float *)(ray + 100);
        auVar78._8_4_ = auVar50._8_4_ * *(float *)(ray + 0x68);
        auVar78._12_4_ = auVar50._12_4_ * *(float *)(ray + 0x6c);
        auVar78._16_4_ = auVar50._16_4_ * *(float *)(ray + 0x70);
        auVar78._20_4_ = auVar50._20_4_ * *(float *)(ray + 0x74);
        auVar78._24_4_ = auVar50._24_4_ * *(float *)(ray + 0x78);
        auVar78._28_4_ = 0;
        auVar74._0_4_ = uVar86 ^ auVar14._0_4_;
        auVar74._4_4_ = uVar87 ^ auVar14._4_4_;
        auVar74._8_4_ = uVar88 ^ auVar14._8_4_;
        auVar74._12_4_ = uVar89 ^ auVar14._12_4_;
        auVar74._16_4_ = uVar41;
        auVar74._20_4_ = uVar90;
        auVar74._24_4_ = uVar91;
        auVar74._28_4_ = uVar92;
        auVar30._4_4_ = auVar50._4_4_ * *(float *)(ray + 0x104);
        auVar30._0_4_ = auVar50._0_4_ * *(float *)(ray + 0x100);
        auVar30._8_4_ = auVar50._8_4_ * *(float *)(ray + 0x108);
        auVar30._12_4_ = auVar50._12_4_ * *(float *)(ray + 0x10c);
        auVar30._16_4_ = auVar50._16_4_ * *(float *)(ray + 0x110);
        auVar30._20_4_ = auVar50._20_4_ * *(float *)(ray + 0x114);
        auVar30._24_4_ = auVar50._24_4_ * *(float *)(ray + 0x118);
        auVar30._28_4_ = auVar7._28_4_;
        uVar10 = vcmpps_avx512vl(auVar74,auVar30,2);
        uVar11 = vcmpps_avx512vl(auVar78,auVar74,1);
        bVar36 = bVar36 & (byte)uVar10 & (byte)uVar11;
        if (bVar36 == 0) {
LAB_01f5a090:
          bVar36 = 0;
          auVar49 = local_5a20;
          auVar67 = local_5a00;
          auVar66 = local_59e0;
          auVar50 = local_59c0;
          auVar74 = local_59a0;
          auVar83 = _local_5980;
          auVar63 = _local_5960;
        }
        else {
          uVar10 = vcmpps_avx512vl(ZEXT1632(auVar47),ZEXT832(0) << 0x20,4);
          bVar36 = bVar36 & (byte)uVar10;
          auVar49 = ZEXT1632(auVar15);
          if (bVar36 == 0) goto LAB_01f5a090;
        }
        _local_5960 = auVar63;
        _local_5980 = auVar83;
        local_59a0 = auVar74;
        local_59c0 = auVar50;
        local_59e0 = auVar66;
        local_5a00 = auVar67;
        local_5a20 = auVar49;
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar97 = ZEXT3264(auVar50);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar98 = ZEXT3264(auVar50);
        auVar47 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
        auVar99 = ZEXT1664(auVar47);
        context = local_5d18;
      }
      auVar47 = auVar99._0_16_;
      local_5d10 = (context->scene->geometries).items[uVar46].ptr;
      uVar86 = local_5d10->mask;
      auVar71._4_4_ = uVar86;
      auVar71._0_4_ = uVar86;
      auVar71._8_4_ = uVar86;
      auVar71._12_4_ = uVar86;
      auVar71._16_4_ = uVar86;
      auVar71._20_4_ = uVar86;
      auVar71._24_4_ = uVar86;
      auVar71._28_4_ = uVar86;
      uVar10 = vptestmd_avx512vl(auVar71,*(undefined1 (*) [32])(ray + 0x120));
      bVar36 = (byte)uVar10 & bVar36;
      if (bVar36 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (local_5d10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar50 = vrcp14ps_avx512vl(local_59c0);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = 0x3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar49 = vfnmadd213ps_avx512vl(auVar50,local_59c0,auVar25);
          auVar14 = vfmadd132ps_fma(auVar49,auVar50,auVar50);
          local_58e0._4_4_ = auVar14._4_4_ * (float)local_5960._4_4_;
          local_58e0._0_4_ = auVar14._0_4_ * (float)local_5960._0_4_;
          local_58e0._8_4_ = auVar14._8_4_ * fStack_5958;
          local_58e0._12_4_ = auVar14._12_4_ * fStack_5954;
          local_58e0._16_4_ = fStack_5950 * 0.0;
          local_58e0._20_4_ = fStack_594c * 0.0;
          local_58e0._24_4_ = fStack_5948 * 0.0;
          local_58e0._28_4_ = auVar50._28_4_;
          local_58c0 = auVar14._0_4_ * (float)local_5980._0_4_;
          fStack_58bc = auVar14._4_4_ * (float)local_5980._4_4_;
          fStack_58b8 = auVar14._8_4_ * fStack_5978;
          fStack_58b4 = auVar14._12_4_ * fStack_5974;
          fStack_58b0 = fStack_5970 * 0.0;
          fStack_58ac = fStack_596c * 0.0;
          uStack_58a4 = local_59c0._28_4_;
          fStack_58a8 = fStack_5968 * 0.0;
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_59e0._0_8_;
          uStack_5938 = local_59e0._8_8_;
          uStack_5930 = local_59e0._16_8_;
          uStack_5928 = local_59e0._24_8_;
          local_5920 = local_5a00._0_8_;
          uStack_5918 = local_5a00._8_8_;
          uStack_5910 = local_5a00._16_8_;
          uStack_5908 = local_5a00._24_8_;
          local_5900 = local_5a20;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = context->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = context->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c60 = *(int *)(ray + 0x100);
          iStack_5c5c = *(int *)(ray + 0x104);
          iStack_5c58 = *(int *)(ray + 0x108);
          iStack_5c54 = *(int *)(ray + 0x10c);
          iStack_5c50 = *(int *)(ray + 0x110);
          iStack_5c4c = *(int *)(ray + 0x114);
          iStack_5c48 = *(int *)(ray + 0x118);
          iStack_5c44 = *(int *)(ray + 0x11c);
          auVar50 = vmulps_avx512vl(ZEXT1632(auVar14),local_59a0);
          bVar44 = (bool)(bVar36 >> 1 & 1);
          bVar2 = (bool)(bVar36 >> 2 & 1);
          bVar3 = (bool)(bVar36 >> 3 & 1);
          bVar4 = (bool)(bVar36 >> 4 & 1);
          bVar5 = (bool)(bVar36 >> 5 & 1);
          bVar6 = (bool)(bVar36 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar36 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar36 & 1) * local_5c60;
          *(uint *)(ray + 0x104) = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * iStack_5c5c;
          *(uint *)(ray + 0x108) = (uint)bVar2 * auVar50._8_4_ | (uint)!bVar2 * iStack_5c58;
          *(uint *)(ray + 0x10c) = (uint)bVar3 * auVar50._12_4_ | (uint)!bVar3 * iStack_5c54;
          *(uint *)(ray + 0x110) = (uint)bVar4 * auVar50._16_4_ | (uint)!bVar4 * iStack_5c50;
          *(uint *)(ray + 0x114) = (uint)bVar5 * auVar50._20_4_ | (uint)!bVar5 * iStack_5c4c;
          *(uint *)(ray + 0x118) = (uint)bVar6 * auVar50._24_4_ | (uint)!bVar6 * iStack_5c48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar36 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar36 >> 7) * iStack_5c44;
          local_5c80 = vpmovm2d_avx512vl((ulong)bVar36);
          local_5cb0.valid = (int *)local_5c80;
          local_5cb0.geometryUserPtr = local_5d10->userPtr;
          local_5cb0.context = context->user;
          local_5cb0.hit = (RTCHitN *)&local_5940;
          local_5cb0.N = 8;
          local_5cb0.ray = (RTCRayN *)ray;
          if (local_5d10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*local_5d10->occlusionFilterN)(&local_5cb0);
            auVar47 = vxorps_avx512vl(auVar47,auVar47);
            auVar99 = ZEXT1664(auVar47);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar98 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar97 = ZEXT3264(auVar50);
            context = local_5d18;
          }
          auVar47 = auVar99._0_16_;
          if (local_5c80 == (undefined1  [32])0x0) {
            uVar46 = 0;
          }
          else {
            p_Var1 = context->args->filter;
            if ((p_Var1 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_5d10->field_8).field_0x2 & 0x40) != 0))))
            {
              (*p_Var1)(&local_5cb0);
              auVar47 = vxorps_avx512vl(auVar47,auVar47);
              auVar99 = ZEXT1664(auVar47);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar98 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar97 = ZEXT3264(auVar50);
              context = local_5d18;
            }
            uVar46 = vptestmd_avx512vl(local_5c80,local_5c80);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar44 = (bool)((byte)uVar46 & 1);
            auVar69._0_4_ =
                 (uint)bVar44 * auVar50._0_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x100);
            bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar69._4_4_ =
                 (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x104);
            bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar69._8_4_ =
                 (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x108);
            bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar69._12_4_ =
                 (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x10c);
            bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar69._16_4_ =
                 (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x110);
            bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar69._20_4_ =
                 (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x114);
            bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar69._24_4_ =
                 (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x118);
            bVar44 = SUB81(uVar46 >> 7,0);
            auVar69._28_4_ =
                 (uint)bVar44 * auVar50._28_4_ | (uint)!bVar44 * *(int *)(local_5cb0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5cb0.ray + 0x100) = auVar69;
          }
          bVar36 = (byte)uVar46;
          auVar70._0_4_ =
               (uint)(bVar36 & 1) * *(int *)local_5d00 | (uint)!(bool)(bVar36 & 1) * local_5c60;
          bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar70._4_4_ = (uint)bVar44 * *(int *)(local_5d00 + 4) | (uint)!bVar44 * iStack_5c5c;
          bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar70._8_4_ = (uint)bVar44 * *(int *)(local_5d00 + 8) | (uint)!bVar44 * iStack_5c58;
          bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar70._12_4_ = (uint)bVar44 * *(int *)(local_5d00 + 0xc) | (uint)!bVar44 * iStack_5c54;
          bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar70._16_4_ = (uint)bVar44 * *(int *)(local_5d00 + 0x10) | (uint)!bVar44 * iStack_5c50;
          bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar70._20_4_ = (uint)bVar44 * *(int *)(local_5d00 + 0x14) | (uint)!bVar44 * iStack_5c4c;
          bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar70._24_4_ = (uint)bVar44 * *(int *)(local_5d00 + 0x18) | (uint)!bVar44 * iStack_5c48;
          bVar44 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar70._28_4_ = (uint)bVar44 * *(int *)(local_5d00 + 0x1c) | (uint)!bVar44 * iStack_5c44;
          *(undefined1 (*) [32])local_5d00 = auVar70;
        }
        bVar34 = local_5ce0[0] & ~bVar36;
      }
      if ((bVar34 == 0) || (bVar44 = 2 < uVar42, uVar42 = uVar42 + 1, bVar44)) break;
    }
    bVar33 = bVar33 & bVar34;
    if (bVar33 == 0) break;
  }
  bVar33 = ~bVar33;
LAB_01f5a0b7:
  bVar39 = bVar39 | bVar33;
  if (bVar39 == 0xff) {
    bVar39 = 0xff;
    goto LAB_01f5a1cb;
  }
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5a40._0_4_ =
       (uint)(bVar39 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar39 & 1) * local_5a40._0_4_;
  bVar44 = (bool)(bVar39 >> 1 & 1);
  local_5a40._4_4_ = (uint)bVar44 * auVar50._4_4_ | (uint)!bVar44 * local_5a40._4_4_;
  bVar44 = (bool)(bVar39 >> 2 & 1);
  local_5a40._8_4_ = (uint)bVar44 * auVar50._8_4_ | (uint)!bVar44 * local_5a40._8_4_;
  bVar44 = (bool)(bVar39 >> 3 & 1);
  local_5a40._12_4_ = (uint)bVar44 * auVar50._12_4_ | (uint)!bVar44 * local_5a40._12_4_;
  bVar44 = (bool)(bVar39 >> 4 & 1);
  local_5a40._16_4_ = (uint)bVar44 * auVar50._16_4_ | (uint)!bVar44 * local_5a40._16_4_;
  bVar44 = (bool)(bVar39 >> 5 & 1);
  local_5a40._20_4_ = (uint)bVar44 * auVar50._20_4_ | (uint)!bVar44 * local_5a40._20_4_;
  bVar44 = (bool)(bVar39 >> 6 & 1);
  local_5a40._24_4_ = (uint)bVar44 * auVar50._24_4_ | (uint)!bVar44 * local_5a40._24_4_;
  local_5a40._28_4_ =
       (uint)(bVar39 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar39 >> 7) * local_5a40._28_4_;
  goto LAB_01f59861;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }